

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buflist.c
# Opt level: O0

int lws_buflist_linear_use(lws_buflist **head,uint8_t *buf,size_t len)

{
  uint8_t *local_30;
  size_t s;
  uint8_t *obuf;
  size_t len_local;
  uint8_t *buf_local;
  lws_buflist **head_local;
  
  obuf = (uint8_t *)len;
  len_local = (size_t)buf;
  while (*head != (lws_buflist *)0x0 && obuf != (uint8_t *)0x0) {
    local_30 = (uint8_t *)((*head)->len - (*head)->pos);
    if (obuf < local_30) {
      local_30 = obuf;
    }
    memcpy((void *)len_local,(void *)((long)&(*head)[1].pos + (*head)->pos),(size_t)local_30);
    obuf = obuf + -(long)local_30;
    len_local = (size_t)(local_30 + len_local);
    lws_buflist_use_segment(head,(size_t)local_30);
  }
  return (int)len_local - (int)buf;
}

Assistant:

int
lws_buflist_linear_use(struct lws_buflist **head, uint8_t *buf, size_t len)
{
	uint8_t *obuf = buf;
	size_t s;

	while (*head && len) {
		s = (*head)->len - (*head)->pos;
		if (s > len)
			s = len;
		memcpy(buf, ((uint8_t *)((*head) + 1)) +
			    LWS_PRE + (*head)->pos, s);
		len -= s;
		buf += s;
		lws_buflist_use_segment(head, s);
	}

	return lws_ptr_diff(buf, obuf);
}